

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O0

bool __thiscall spvtools::AssemblyContext::isStartOfNewInst(AssemblyContext *this)

{
  bool bVar1;
  spv_result_t sVar2;
  char *pcVar3;
  undefined1 local_50 [8];
  string word;
  spv_position_t pos;
  AssemblyContext *this_local;
  
  word.field_2._8_8_ = (this->current_position_).line;
  sVar2 = anon_unknown_6::advance(this->text_,(spv_position)((long)&word.field_2 + 8));
  if (sVar2 == SPV_SUCCESS) {
    bVar1 = anon_unknown_6::startsWithOp(this->text_,(spv_position)((long)&word.field_2 + 8));
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::string::string((string *)local_50);
      word.field_2._8_8_ = (this->current_position_).line;
      sVar2 = anon_unknown_6::getWord
                        (this->text_,(spv_position)((long)&word.field_2 + 8),(string *)local_50);
      if (sVar2 == SPV_SUCCESS) {
        pcVar3 = (char *)std::__cxx11::string::front();
        if (*pcVar3 == '%') {
          sVar2 = anon_unknown_6::advance(this->text_,(spv_position)((long)&word.field_2 + 8));
          if (sVar2 == SPV_SUCCESS) {
            sVar2 = anon_unknown_6::getWord
                              (this->text_,(spv_position)((long)&word.field_2 + 8),
                               (string *)local_50);
            if (sVar2 == SPV_SUCCESS) {
              bVar1 = std::operator!=("=",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_50);
              if (bVar1) {
                this_local._7_1_ = false;
              }
              else {
                sVar2 = anon_unknown_6::advance(this->text_,(spv_position)((long)&word.field_2 + 8))
                ;
                if (sVar2 == SPV_SUCCESS) {
                  bVar1 = anon_unknown_6::startsWithOp
                                    (this->text_,(spv_position)((long)&word.field_2 + 8));
                  if (bVar1) {
                    this_local._7_1_ = true;
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AssemblyContext::isStartOfNewInst() {
  spv_position_t pos = current_position_;
  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::startsWithOp(text_, &pos)) return true;

  std::string word;
  pos = current_position_;
  if (spvtools::getWord(text_, &pos, &word)) return false;
  if ('%' != word.front()) return false;

  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::getWord(text_, &pos, &word)) return false;
  if ("=" != word) return false;

  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::startsWithOp(text_, &pos)) return true;
  return false;
}